

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

void Dar_LibAddNode(Dar_Lib_t *p,int Id0,int Id1,int fCompl0,int fCompl1)

{
  int iVar1;
  Dar_LibObj_t *pDVar2;
  Dar_LibObj_t *pDVar3;
  Dar_LibObj_t *pDVar4;
  uint local_44;
  uint local_3c;
  Dar_LibObj_t *pObj;
  Dar_LibObj_t *pFan1;
  Dar_LibObj_t *pFan0;
  int fCompl1_local;
  int fCompl0_local;
  int Id1_local;
  int Id0_local;
  Dar_Lib_t *p_local;
  
  pDVar2 = Dar_LibObj(p,Id0);
  pDVar3 = Dar_LibObj(p,Id1);
  iVar1 = p->iObj;
  p->iObj = iVar1 + 1;
  pDVar4 = p->pObjs + iVar1;
  *pDVar4 = (Dar_LibObj_t)((ulong)*pDVar4 & 0xffffffffffff0000 | (ulong)(uint)Id0 & 0xffff);
  *pDVar4 = (Dar_LibObj_t)
            ((ulong)*pDVar4 & 0xffffffff0000ffff | ((ulong)(uint)Id1 & 0xffff) << 0x10);
  *pDVar4 = (Dar_LibObj_t)((ulong)*pDVar4 & 0xfffffffeffffffff | ((ulong)(uint)fCompl0 & 1) << 0x20)
  ;
  *pDVar4 = (Dar_LibObj_t)((ulong)*pDVar4 & 0xfffffffdffffffff | ((ulong)(uint)fCompl1 & 1) << 0x21)
  ;
  *pDVar4 = (Dar_LibObj_t)
            ((ulong)*pDVar4 & 0xfffffffbffffffff |
            ((ulong)((fCompl0 ^ SUB84(*pDVar2,4) >> 2 & 1) & (fCompl1 ^ SUB84(*pDVar3,4) >> 2 & 1))
            & 1) << 0x22);
  if (fCompl0 == 0) {
    local_3c = SUB84(*pDVar2,4) >> 4;
  }
  else {
    local_3c = SUB84(*pDVar2,4) >> 4 ^ 0xffffffff;
  }
  if (fCompl1 == 0) {
    local_44 = SUB84(*pDVar3,4) >> 4;
  }
  else {
    local_44 = SUB84(*pDVar3,4) >> 4 ^ 0xffffffff;
  }
  *pDVar4 = (Dar_LibObj_t)
            ((ulong)*pDVar4 & 0xfffffffff | (ulong)(local_3c & 0xffff & local_44) << 0x24);
  return;
}

Assistant:

void Dar_LibAddNode( Dar_Lib_t * p, int Id0, int Id1, int fCompl0, int fCompl1 )
{
    Dar_LibObj_t * pFan0 = Dar_LibObj( p, Id0 );
    Dar_LibObj_t * pFan1 = Dar_LibObj( p, Id1 );
    Dar_LibObj_t * pObj  = p->pObjs + p->iObj++;
    pObj->Fan0 = Id0;
    pObj->Fan1 = Id1;
    pObj->fCompl0 = fCompl0;
    pObj->fCompl1 = fCompl1;
    pObj->fPhase = (fCompl0 ^ pFan0->fPhase) & (fCompl1 ^ pFan1->fPhase);
    pObj->Num = 0xFFFF & (fCompl0? ~pFan0->Num : pFan0->Num) & (fCompl1? ~pFan1->Num : pFan1->Num);
}